

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O1

int neverbleed_init(neverbleed_t *nb,char *errbuf)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  undefined8 uVar4;
  RSA_METHOD *rsa_meth;
  undefined8 uVar5;
  int *piVar6;
  char *pcVar7;
  char *__template;
  ENGINE *e;
  char *pcVar8;
  char *tempdir;
  int pipe_fds [2];
  int local_40 [2];
  char *local_38;
  
  local_40[0] = -1;
  local_40[1] = -1;
  uVar4 = RSA_PKCS1_OpenSSL();
  rsa_meth = (RSA_METHOD *)RSA_meth_new("privsep RSA method",0);
  RSA_meth_set_priv_enc(rsa_meth,priv_enc_proxy);
  RSA_meth_set_priv_dec(rsa_meth,priv_dec_proxy);
  RSA_meth_set_sign(rsa_meth,sign_proxy);
  uVar5 = RSA_meth_get_pub_enc(uVar4);
  RSA_meth_set_pub_enc(rsa_meth,uVar5);
  uVar5 = RSA_meth_get_pub_dec(uVar4);
  RSA_meth_set_pub_dec(rsa_meth,uVar5);
  uVar4 = RSA_meth_get_verify(uVar4);
  RSA_meth_set_verify(rsa_meth,uVar4);
  RSA_meth_set_finish(rsa_meth,priv_rsa_finish);
  uVar4 = EC_KEY_get_default_method();
  uVar4 = EC_KEY_METHOD_new(uVar4);
  EC_KEY_METHOD_set_keygen(uVar4,0);
  EC_KEY_METHOD_set_compute_key(uVar4,0);
  EC_KEY_METHOD_set_sign(uVar4,ecdsa_sign_proxy,0,0);
  EC_KEY_METHOD_set_init(uVar4,0,priv_ecdsa_finish,0,0,0,0);
  iVar1 = pipe(local_40);
  if (iVar1 != 0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    pcVar8 = "pipe(2) failed:%s";
    __template = (char *)0x0;
    goto LAB_0018af2f;
  }
  iVar1 = local_40[1];
  iVar2 = fcntl(local_40[1],2,0x80000);
  if (iVar2 == -1) {
    dief("failed to set O_CLOEXEC to fd %d",(ulong)(uint)iVar1);
  }
  __template = strdup("/tmp/openssl-privsep.XXXXXX");
  if (__template == (char *)0x0) {
    builtin_strncpy(errbuf,"no memory",10);
    iVar1 = -1;
    __template = (char *)0x0;
    goto LAB_0018af46;
  }
  pcVar7 = mkdtemp(__template);
  if (pcVar7 == (char *)0x0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    pcVar8 = "failed to create temporary directory under /tmp:%s";
LAB_0018af2f:
    snprintf(errbuf,0x100,pcVar8,pcVar7);
  }
  else {
    (nb->sun_).sun_family = 0;
    (nb->sun_).sun_path[0] = '\0';
    (nb->sun_).sun_path[1] = '\0';
    (nb->sun_).sun_path[2] = '\0';
    (nb->sun_).sun_path[3] = '\0';
    (nb->sun_).sun_path[4] = '\0';
    (nb->sun_).sun_path[5] = '\0';
    (nb->sun_).sun_path[6] = '\0';
    (nb->sun_).sun_path[7] = '\0';
    (nb->sun_).sun_path[8] = '\0';
    (nb->sun_).sun_path[9] = '\0';
    (nb->sun_).sun_path[10] = '\0';
    (nb->sun_).sun_path[0xb] = '\0';
    (nb->sun_).sun_path[0xc] = '\0';
    (nb->sun_).sun_path[0xd] = '\0';
    (nb->sun_).sun_path[0x5c] = '\0';
    (nb->sun_).sun_path[0x5d] = '\0';
    (nb->sun_).sun_path[0x5e] = '\0';
    (nb->sun_).sun_path[0x5f] = '\0';
    (nb->sun_).sun_path[0x60] = '\0';
    (nb->sun_).sun_path[0x61] = '\0';
    (nb->sun_).sun_path[0x62] = '\0';
    (nb->sun_).sun_path[99] = '\0';
    (nb->sun_).sun_path[100] = '\0';
    (nb->sun_).sun_path[0x65] = '\0';
    (nb->sun_).sun_path[0x66] = '\0';
    (nb->sun_).sun_path[0x67] = '\0';
    (nb->sun_).sun_path[0x68] = '\0';
    (nb->sun_).sun_path[0x69] = '\0';
    (nb->sun_).sun_path[0x6a] = '\0';
    (nb->sun_).sun_path[0x6b] = '\0';
    (nb->sun_).sun_path[0x4e] = '\0';
    (nb->sun_).sun_path[0x4f] = '\0';
    (nb->sun_).sun_path[0x50] = '\0';
    (nb->sun_).sun_path[0x51] = '\0';
    (nb->sun_).sun_path[0x52] = '\0';
    (nb->sun_).sun_path[0x53] = '\0';
    (nb->sun_).sun_path[0x54] = '\0';
    (nb->sun_).sun_path[0x55] = '\0';
    (nb->sun_).sun_path[0x56] = '\0';
    (nb->sun_).sun_path[0x57] = '\0';
    (nb->sun_).sun_path[0x58] = '\0';
    (nb->sun_).sun_path[0x59] = '\0';
    (nb->sun_).sun_path[0x5a] = '\0';
    (nb->sun_).sun_path[0x5b] = '\0';
    (nb->sun_).sun_path[0x5c] = '\0';
    (nb->sun_).sun_path[0x5d] = '\0';
    (nb->sun_).sun_path[0x3e] = '\0';
    (nb->sun_).sun_path[0x3f] = '\0';
    (nb->sun_).sun_path[0x40] = '\0';
    (nb->sun_).sun_path[0x41] = '\0';
    (nb->sun_).sun_path[0x42] = '\0';
    (nb->sun_).sun_path[0x43] = '\0';
    (nb->sun_).sun_path[0x44] = '\0';
    (nb->sun_).sun_path[0x45] = '\0';
    (nb->sun_).sun_path[0x46] = '\0';
    (nb->sun_).sun_path[0x47] = '\0';
    (nb->sun_).sun_path[0x48] = '\0';
    (nb->sun_).sun_path[0x49] = '\0';
    (nb->sun_).sun_path[0x4a] = '\0';
    (nb->sun_).sun_path[0x4b] = '\0';
    (nb->sun_).sun_path[0x4c] = '\0';
    (nb->sun_).sun_path[0x4d] = '\0';
    (nb->sun_).sun_path[0x2e] = '\0';
    (nb->sun_).sun_path[0x2f] = '\0';
    (nb->sun_).sun_path[0x30] = '\0';
    (nb->sun_).sun_path[0x31] = '\0';
    (nb->sun_).sun_path[0x32] = '\0';
    (nb->sun_).sun_path[0x33] = '\0';
    (nb->sun_).sun_path[0x34] = '\0';
    (nb->sun_).sun_path[0x35] = '\0';
    (nb->sun_).sun_path[0x36] = '\0';
    (nb->sun_).sun_path[0x37] = '\0';
    (nb->sun_).sun_path[0x38] = '\0';
    (nb->sun_).sun_path[0x39] = '\0';
    (nb->sun_).sun_path[0x3a] = '\0';
    (nb->sun_).sun_path[0x3b] = '\0';
    (nb->sun_).sun_path[0x3c] = '\0';
    (nb->sun_).sun_path[0x3d] = '\0';
    (nb->sun_).sun_path[0x1e] = '\0';
    (nb->sun_).sun_path[0x1f] = '\0';
    (nb->sun_).sun_path[0x20] = '\0';
    (nb->sun_).sun_path[0x21] = '\0';
    (nb->sun_).sun_path[0x22] = '\0';
    (nb->sun_).sun_path[0x23] = '\0';
    (nb->sun_).sun_path[0x24] = '\0';
    (nb->sun_).sun_path[0x25] = '\0';
    (nb->sun_).sun_path[0x26] = '\0';
    (nb->sun_).sun_path[0x27] = '\0';
    (nb->sun_).sun_path[0x28] = '\0';
    (nb->sun_).sun_path[0x29] = '\0';
    (nb->sun_).sun_path[0x2a] = '\0';
    (nb->sun_).sun_path[0x2b] = '\0';
    (nb->sun_).sun_path[0x2c] = '\0';
    (nb->sun_).sun_path[0x2d] = '\0';
    (nb->sun_).sun_path[0xe] = '\0';
    (nb->sun_).sun_path[0xf] = '\0';
    (nb->sun_).sun_path[0x10] = '\0';
    (nb->sun_).sun_path[0x11] = '\0';
    (nb->sun_).sun_path[0x12] = '\0';
    (nb->sun_).sun_path[0x13] = '\0';
    (nb->sun_).sun_path[0x14] = '\0';
    (nb->sun_).sun_path[0x15] = '\0';
    (nb->sun_).sun_path[0x16] = '\0';
    (nb->sun_).sun_path[0x17] = '\0';
    (nb->sun_).sun_path[0x18] = '\0';
    (nb->sun_).sun_path[0x19] = '\0';
    (nb->sun_).sun_path[0x1a] = '\0';
    (nb->sun_).sun_path[0x1b] = '\0';
    (nb->sun_).sun_path[0x1c] = '\0';
    (nb->sun_).sun_path[0x1d] = '\0';
    (nb->sun_).sun_family = 1;
    local_38 = (nb->sun_).sun_path;
    snprintf(local_38,0x6c,"%s/_",__template);
    RAND_bytes(nb->auth_token,0x20);
    iVar1 = socket(1,1,0);
    if (iVar1 == -1) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      pcVar8 = "socket(2) failed:%s";
      goto LAB_0018af2f;
    }
    iVar2 = bind(iVar1,(sockaddr *)&nb->sun_,0x6e);
    if (iVar2 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      snprintf(errbuf,0x100,"failed to bind to %s:%s",local_38,pcVar7);
      goto LAB_0018af46;
    }
    iVar2 = listen(iVar1,0x1000);
    if (iVar2 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      pcVar8 = "listen(2) failed:%s";
LAB_0018b1ee:
      snprintf(errbuf,0x100,pcVar8,pcVar7);
      goto LAB_0018af46;
    }
    _Var3 = fork();
    nb->daemon_pid = _Var3;
    if (_Var3 == -1) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      pcVar8 = "fork(2) failed:%s";
      goto LAB_0018b1ee;
    }
    if (_Var3 == 0) {
      close(local_40[1]);
      prctl(4,0,0,0,0);
      daemon_vars.nb = nb;
      daemon_main(iVar1,local_40[0],tempdir);
    }
    close(iVar1);
    close(local_40[0]);
    local_40[0] = 0xffffffff;
    e = ENGINE_new();
    nb->engine = (ENGINE *)e;
    if ((((e != (ENGINE *)0x0) && (iVar1 = ENGINE_set_id(e,"neverbleed"), iVar1 != 0)) &&
        (iVar1 = ENGINE_set_name((ENGINE *)nb->engine,"privilege separation software engine"),
        iVar1 != 0)) &&
       ((iVar1 = ENGINE_set_RSA((ENGINE *)nb->engine,rsa_meth), iVar1 != 0 &&
        (iVar1 = ENGINE_set_EC(nb->engine,uVar4), iVar1 != 0)))) {
      ENGINE_add((ENGINE *)nb->engine);
      pthread_key_create(&nb->thread_key,dispose_thread_data);
      free(__template);
      return 0;
    }
    builtin_strncpy(errbuf,"failed to initialize the OpenSSL engine",0x28);
  }
  iVar1 = -1;
LAB_0018af46:
  if (local_40[0] != -1) {
    close(local_40[0]);
  }
  if (local_40[1] != -1) {
    close(local_40[1]);
  }
  if (__template != (char *)0x0) {
    unlink_dir(__template);
    free(__template);
  }
  if (iVar1 != -1) {
    close(iVar1);
  }
  if ((ENGINE *)nb->engine != (ENGINE *)0x0) {
    ENGINE_free((ENGINE *)nb->engine);
    nb->engine = (ENGINE *)0x0;
  }
  return -1;
}

Assistant:

int neverbleed_init(neverbleed_t *nb, char *errbuf)
{
    int pipe_fds[2] = {-1, -1}, listen_fd = -1;
    char *tempdir = NULL;
#if OPENSSL_1_1_API
    const RSA_METHOD *default_method = RSA_PKCS1_OpenSSL();
    EC_KEY_METHOD *ecdsa_method;
    const EC_KEY_METHOD *ecdsa_default_method;
    RSA_METHOD *rsa_method = RSA_meth_new("privsep RSA method", 0);

    RSA_meth_set_priv_enc(rsa_method, priv_enc_proxy);
    RSA_meth_set_priv_dec(rsa_method, priv_dec_proxy);
    RSA_meth_set_sign(rsa_method, sign_proxy);

    RSA_meth_set_pub_enc(rsa_method, RSA_meth_get_pub_enc(default_method));
    RSA_meth_set_pub_dec(rsa_method, RSA_meth_get_pub_dec(default_method));
    RSA_meth_set_verify(rsa_method, RSA_meth_get_verify(default_method));

    RSA_meth_set_finish(rsa_method, priv_rsa_finish);

    /* setup EC_KEY_METHOD for ECDSA */
    ecdsa_default_method = EC_KEY_get_default_method();
    ecdsa_method = EC_KEY_METHOD_new(ecdsa_default_method);

    EC_KEY_METHOD_set_keygen(ecdsa_method, NULL);
    EC_KEY_METHOD_set_compute_key(ecdsa_method, NULL);
    /* it seems sign_sig and sign_setup is not used in TLS ECDSA. */
    EC_KEY_METHOD_set_sign(ecdsa_method, ecdsa_sign_proxy, NULL, NULL);
    EC_KEY_METHOD_set_init(ecdsa_method, NULL, priv_ecdsa_finish, NULL, NULL, NULL, NULL);
#else
    const RSA_METHOD *default_method = RSA_PKCS1_SSLeay();
    RSA_METHOD *rsa_method = &static_rsa_method;

    rsa_method->rsa_pub_enc = default_method->rsa_pub_enc;
    rsa_method->rsa_pub_dec = default_method->rsa_pub_dec;
    rsa_method->rsa_verify = default_method->rsa_verify;
#endif

    /* setup the daemon */
    if (pipe(pipe_fds) != 0) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "pipe(2) failed:%s", strerror(errno));
        goto Fail;
    }
    set_cloexec(pipe_fds[1]);
    if ((tempdir = strdup("/tmp/openssl-privsep.XXXXXX")) == NULL) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "no memory");
        goto Fail;
    }
    if (mkdtemp(tempdir) == NULL) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "failed to create temporary directory under /tmp:%s", strerror(errno));
        goto Fail;
    }
    memset(&nb->sun_, 0, sizeof(nb->sun_));
    nb->sun_.sun_family = AF_UNIX;
    snprintf(nb->sun_.sun_path, sizeof(nb->sun_.sun_path), "%s/_", tempdir);
    RAND_bytes(nb->auth_token, sizeof(nb->auth_token));
    if ((listen_fd = socket(PF_UNIX, SOCK_STREAM, 0)) == -1) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "socket(2) failed:%s", strerror(errno));
        goto Fail;
    }
    if (bind(listen_fd, (void *)&nb->sun_, sizeof(nb->sun_)) != 0) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "failed to bind to %s:%s", nb->sun_.sun_path, strerror(errno));
        goto Fail;
    }
    if (listen(listen_fd, SOMAXCONN) != 0) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "listen(2) failed:%s", strerror(errno));
        goto Fail;
    }
    nb->daemon_pid = fork();
    switch (nb->daemon_pid) {
    case -1:
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "fork(2) failed:%s", strerror(errno));
        goto Fail;
    case 0:
        close(pipe_fds[1]);
#ifdef __linux__
        prctl(PR_SET_DUMPABLE, 0, 0, 0, 0);
#endif
        daemon_vars.nb = nb;
        daemon_main(listen_fd, pipe_fds[0], tempdir);
        break;
    default:
        break;
    }
    close(listen_fd);
    listen_fd = -1;
    close(pipe_fds[0]);
    pipe_fds[0] = -1;

    /* setup engine */
    if ((nb->engine = ENGINE_new()) == NULL || !ENGINE_set_id(nb->engine, "neverbleed") ||
        !ENGINE_set_name(nb->engine, "privilege separation software engine") || !ENGINE_set_RSA(nb->engine, rsa_method)
#if OPENSSL_1_1_API
        || !ENGINE_set_EC(nb->engine, ecdsa_method)
#endif
            ) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "failed to initialize the OpenSSL engine");
        goto Fail;
    }
    ENGINE_add(nb->engine);

    /* setup thread key */
    pthread_key_create(&nb->thread_key, dispose_thread_data);

    free(tempdir);
    return 0;
Fail:
    if (pipe_fds[0] != -1)
        close(pipe_fds[0]);
    if (pipe_fds[1] != -1)
        close(pipe_fds[1]);
    if (tempdir != NULL) {
        unlink_dir(tempdir);
        free(tempdir);
    }
    if (listen_fd != -1)
        close(listen_fd);
    if (nb->engine != NULL) {
        ENGINE_free(nb->engine);
        nb->engine = NULL;
    }
    return -1;
}